

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_api.c
# Opt level: O0

int chain_and_assign_src_ip(pcp_server_t *s,void *data)

{
  undefined4 uVar1;
  uint32_t uVar2;
  int iVar3;
  pcp_flow_t *f_00;
  size_t sVar4;
  char *pcVar5;
  bool bVar6;
  in6_addr *__a_1;
  in6_addr *__a;
  pcp_flow_t *f;
  undefined1 auStack_70 [4];
  flow_key_data kd;
  caasi_data *d;
  void *data_local;
  pcp_server_t *s_local;
  
  kd.field_5._16_8_ = data;
  memcpy((void *)((long)&f + 4),*data,0x4c);
  if (s->server_state == pss_not_working) {
    return 0;
  }
  bVar6 = false;
  uVar1 = kd.src_ip.__in6_u.__u6_addr32[0];
  if (((auStack_70 == (undefined1  [4])0x0) && (bVar6 = false, kd._0_4_ == 0)) &&
     (bVar6 = false, kd.src_ip.__in6_u.__u6_addr32[0] == 0)) {
    bVar6 = kd.src_ip.__in6_u.__u6_addr32[1] == 0;
  }
  if (!bVar6) {
    bVar6 = false;
    if ((auStack_70 == (undefined1  [4])0x0) && (bVar6 = false, kd._0_4_ == 0)) {
      uVar2 = htonl(0xffff);
      bVar6 = uVar1 == uVar2;
    }
    if (((!bVar6) || (kd.src_ip.__in6_u.__u6_addr8[4] != '\0')) ||
       ((kd.src_ip.__in6_u.__u6_addr8[5] != '\0' ||
        ((kd.src_ip.__in6_u.__u6_addr8[6] != '\0' || (kd.src_ip.__in6_u.__u6_addr8[7] != '\0'))))))
    goto LAB_001044f2;
  }
  _auStack_70 = *(undefined8 *)s->src_ip;
  kd.src_ip.__in6_u._0_8_ = *(undefined8 *)(s->src_ip + 2);
  kd.pcp_server_ip.__in6_u.__u6_addr32[2] = s->pcp_scope_id;
LAB_001044f2:
  iVar3 = have_same_af((in6_addr *)auStack_70,(in6_addr *)s->src_ip);
  if (iVar3 == 0) {
    s_local._4_4_ = 0;
  }
  else if (kd.pcp_server_ip.__in6_u.__u6_addr32[2] == s->pcp_scope_id) {
    kd.src_ip.__in6_u._8_8_ = *(undefined8 *)s->pcp_ip;
    kd.pcp_server_ip.__in6_u._0_8_ = *(undefined8 *)(s->pcp_ip + 2);
    kd._32_8_ = *(undefined8 *)(s->nonce).n;
    kd.nonce.n[0] = (s->nonce).n[2];
    f_00 = pcp_create_flow(s,(flow_key_data *)((long)&f + 4));
    if (f_00 == (pcp_flow_t *)0x0) {
      s_local._4_4_ = 1;
    }
    else {
      if (f._4_1_ == '\x03') {
        (f_00->field_5).sadscp.toler_fields = *(uint8_t *)(kd.field_5._16_8_ + 0x28);
        if (*(long *)(kd.field_5._16_8_ + 0x30) == 0) {
          (f_00->field_5).sadscp.app_name_length = '\0';
          f_00->sadscp_app_name = (char *)0x0;
        }
        else {
          sVar4 = strlen(*(char **)(kd.field_5._16_8_ + 0x30));
          (f_00->field_5).sadscp.app_name_length = (uint8_t)sVar4;
          pcVar5 = strdup(*(char **)(kd.field_5._16_8_ + 0x30));
          f_00->sadscp_app_name = pcVar5;
        }
      }
      init_flow(f_00,s,*(int *)(kd.field_5._16_8_ + 0x18),*(sockaddr **)(kd.field_5._16_8_ + 0x20));
      f_00->user_data = *(void **)(kd.field_5._16_8_ + 0x38);
      if (*(long *)(kd.field_5._16_8_ + 8) == 0) {
        *(pcp_flow_t **)(kd.field_5._16_8_ + 0x10) = f_00;
      }
      else {
        *(pcp_flow_t **)(*(long *)(kd.field_5._16_8_ + 8) + 0x98) = f_00;
      }
      *(pcp_flow_t **)(kd.field_5._16_8_ + 8) = f_00;
      s_local._4_4_ = 0;
    }
  }
  else {
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

static int chain_and_assign_src_ip(pcp_server_t *s, void *data) {
    struct caasi_data *d = (struct caasi_data *)data;
    struct flow_key_data kd = *d->kd;

    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    if (s->server_state == pss_not_working) {
        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return 0;
    }

    pcp_flow_t *f = NULL;

    if (IPV6_IS_ADDR_ANY(&kd.src_ip)) {
        memcpy(&kd.src_ip, s->src_ip, sizeof(kd.src_ip));
        kd.scope_id = s->pcp_scope_id;
    }

    // check address family
    if (!have_same_af(&kd.src_ip, (struct in6_addr *)s->src_ip)) {
        return 0;
    }

    // check matching scope
    if (kd.scope_id != s->pcp_scope_id) {
        return 0;
    }

    memcpy(&kd.pcp_server_ip, s->pcp_ip, sizeof(kd.pcp_server_ip));
    memcpy(&kd.nonce, &s->nonce, sizeof(kd.nonce));
    f = pcp_create_flow(s, &kd);
    if (!f) {
        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return 1;
    }
#ifdef PCP_SADSCP
    if (kd.operation == PCP_OPCODE_SADSCP) {
        f->sadscp.toler_fields = d->toler_fields;
        if (d->app_name) {
            f->sadscp.app_name_length = strlen(d->app_name);
            f->sadscp_app_name = strdup(d->app_name);
        } else {
            f->sadscp.app_name_length = 0;
            f->sadscp_app_name = NULL;
        }
    }
#endif
    init_flow(f, s, d->lifetime, d->ext_addr);
    f->user_data = d->userdata;
    if (d->fprev) {
        d->fprev->next_child = f;
    } else {
        d->ffirst = f;
    }
    d->fprev = f;

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return 0;
}